

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::
     ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::_::CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>,void*&>
               (SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
                *location,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
               CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
               *params_1,void **params_2)

{
  SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
  *this;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *dependency;
  CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
  *func;
  void **ppvVar1;
  void **params_local_2;
  CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
  *params_local_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local;
  SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
  *location_local;
  
  this = (SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
          *)operator_new(0x38);
  if (this != (SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
               *)0x0) {
    dependency = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(params);
    func = fwd<kj::_::CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>>
                     (params_1);
    ppvVar1 = fwd<void*&>(params_2);
    _::
    SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:544:10)>_>
    ::SimpleTransformPromiseNode(this,dependency,func,*ppvVar1);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}